

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int PatchFrame(int frameNum)

{
  ushort uVar1;
  uint uVar2;
  char *__s1;
  int iVar3;
  uint statenum;
  FState *pFVar4;
  size_t sVar5;
  FState *pFVar6;
  ulong uVar7;
  ulong uVar8;
  spritedef_t *psVar9;
  uint uVar10;
  uint uVar11;
  FState dummy;
  uint local_68;
  uint local_64;
  FState local_58;
  
  pFVar4 = FindState(frameNum);
  if (pFVar4 == (FState *)0x0) {
    uVar10 = 0;
    Printf("Frame %d out of range\n",frameNum);
    pFVar4 = &local_58;
    local_64 = 0;
    local_68 = 0;
  }
  else {
    DPrintf(4,"Frame %d\n",frameNum);
    if (frameNum == 0x2f) {
      local_68 = 5;
    }
    else if (frameNum == 0x30) {
      local_68 = 4;
    }
    else {
      uVar1 = pFVar4->Tics;
      local_68 = (uint)uVar1;
      if (pFVar4->TicRange != 0) {
        uVar10 = FRandom::GenRand32(&FState::pr_statetics);
        local_68 = (uint)uVar1 + uVar10 % (pFVar4->TicRange + 1);
      }
    }
    local_64 = pFVar4->Misc1;
    uVar10 = (pFVar4->StateFlags & 4) << 0xd | (uint)pFVar4->Frame;
  }
  iVar3 = GetLine();
  uVar2 = local_64;
  do {
    if (iVar3 != 1) {
      if (pFVar4 != &local_58) {
        *(byte *)&pFVar4->StateFlags = (byte)pFVar4->StateFlags | 0x40;
        if ((uVar10 & 0x7fc0) != 0) {
          Printf("Frame %d: Subnumber must be in range [0,63]\n",frameNum);
        }
        pFVar4->Tics = (int16_t)local_68;
        pFVar4->Misc1 = uVar2;
        pFVar4->Frame = (byte)uVar10 & 0x3f;
        pFVar4->StateFlags = (ushort)(uVar10 >> 0xd) & 4 | pFVar4->StateFlags & 0xfffb;
      }
      return iVar3;
    }
    statenum = atoi(Line2);
    __s1 = Line1;
    sVar5 = strlen(Line1);
    uVar11 = uVar10;
    local_64 = uVar2;
    switch(sVar5) {
    case 8:
      iVar3 = strcasecmp(__s1,"Duration");
      if (iVar3 != 0) {
        switch(sVar5) {
        case 9:
          goto switchD_003620ea_caseD_9;
        case 10:
          goto switchD_003620ea_caseD_a;
        case 0xd:
          goto switchD_003620ea_caseD_d;
        case 0x10:
          goto switchD_003620ea_caseD_10;
        }
        goto switchD_003620ea_caseD_b;
      }
      if (0x7ffe < (int)statenum) {
        statenum = 0x7fff;
      }
      local_68 = statenum;
      if ((int)statenum < 0) {
        local_68 = 0xffffffff;
      }
      break;
    case 9:
switchD_003620ea_caseD_9:
      iVar3 = strcasecmp(__s1,"Unknown 1");
      local_64 = statenum;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(__s1,"Unknown 2");
        if (iVar3 != 0) {
          if (sVar5 == 10) goto switchD_003620ea_caseD_a;
          if (sVar5 == 0x10) goto switchD_003620ea_caseD_10;
          if (sVar5 == 0xd) goto switchD_003620ea_caseD_d;
          goto switchD_003620ea_caseD_b;
        }
        pFVar4->Misc2 = statenum;
        local_64 = uVar2;
      }
      break;
    case 10:
switchD_003620ea_caseD_a:
      iVar3 = strcasecmp(__s1,"Next frame");
      if (iVar3 != 0) {
        if (sVar5 == 0x10) goto switchD_003620ea_caseD_10;
        goto switchD_003620ea_caseD_b;
      }
      pFVar6 = FindState(statenum);
      pFVar4->NextState = pFVar6;
      local_64 = uVar2;
      break;
    default:
switchD_003620ea_caseD_b:
      Printf("Unknown key %s encountered in %s %d.\n",__s1,"Frame",frameNum);
      uVar11 = uVar10;
      local_64 = uVar2;
      break;
    case 0xd:
switchD_003620ea_caseD_d:
      iVar3 = strcasecmp(__s1,"Sprite number");
      if (iVar3 != 0) {
        if (sVar5 == 0x10) goto switchD_003620ea_caseD_10;
        if (sVar5 == 10) goto switchD_003620ea_caseD_a;
        goto switchD_003620ea_caseD_b;
      }
      if ((int)statenum < (int)OrgSprNames.Count) {
        uVar7 = (ulong)sprites.Count;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar8 = 0;
          psVar9 = sprites.Array;
          do {
            if (*(DWORD *)OrgSprNames.Array[(int)statenum].c == (psVar9->field_0).dwName) {
              pFVar4->sprite = (int32_t)uVar8;
              uVar7 = uVar8;
              break;
            }
            uVar8 = uVar8 + 1;
            psVar9 = psVar9 + 1;
          } while (uVar7 != uVar8);
        }
        local_64 = uVar2;
        if ((uint)uVar7 == sprites.Count) {
          Printf("Frame %d: Sprite %d (%s) is undefined\n",frameNum,(ulong)statenum,
                 OrgSprNames.Array + (int)statenum);
        }
      }
      else {
        Printf("Frame %d: Sprite %d out of range\n",frameNum,(ulong)statenum);
        local_64 = uVar2;
      }
      break;
    case 0x10:
switchD_003620ea_caseD_10:
      iVar3 = strcasecmp(__s1,"Sprite subnumber");
      uVar11 = statenum;
      local_64 = uVar2;
      if (iVar3 != 0) goto switchD_003620ea_caseD_b;
    }
    iVar3 = GetLine();
    uVar10 = uVar11;
    uVar2 = local_64;
  } while( true );
}

Assistant:

static int PatchFrame (int frameNum)
{
	int result;
	int tics, misc1, frame;
	FState *info, dummy;

	info = FindState (frameNum);
	if (info)
	{
		DPrintf (DMSG_SPAMMY, "Frame %d\n", frameNum);
		if (frameNum == 47)
		{ // Use original tics for S_DSGUNFLASH1
			tics = 5;
		}
		else if (frameNum == 48)
		{ // Ditto for S_DSGUNFLASH2
			tics = 4;
		}
		else
		{
			tics = info->GetTics ();
		}
		misc1 = info->GetMisc1 ();
		frame = info->GetFrame () | (info->GetFullbright() ? 0x8000 : 0);
	}
	else
	{
		info = &dummy;
		tics = misc1 = frame = 0;
		Printf ("Frame %d out of range\n", frameNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);
		size_t keylen = strlen (Line1);

		if (keylen == 8 && stricmp (Line1, "Duration") == 0)
		{
			tics = clamp (val, -1, SHRT_MAX);
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 1") == 0)
		{
			misc1 = val;
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 2") == 0)
		{
			info->Misc2 = val;
		}
		else if (keylen == 13 && stricmp (Line1, "Sprite number") == 0)
		{
			unsigned int i;

			if (val < (int)OrgSprNames.Size())
			{
				for (i = 0; i < sprites.Size(); i++)
				{
					if (memcmp (OrgSprNames[val].c, sprites[i].name, 4) == 0)
					{
						info->sprite = (int)i;
						break;
					}
				}
				if (i == sprites.Size ())
				{
					Printf ("Frame %d: Sprite %d (%s) is undefined\n",
						frameNum, val, OrgSprNames[val].c);
				}
			}
			else
			{
				Printf ("Frame %d: Sprite %d out of range\n", frameNum, val);
			}
		}
		else if (keylen == 10 && stricmp (Line1, "Next frame") == 0)
		{
			info->NextState = FindState (val);
		}
		else if (keylen == 16 && stricmp (Line1, "Sprite subnumber") == 0)
		{
			frame = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Frame", frameNum);
		}
	}

	if (info != &dummy)
	{
		info->StateFlags |= STF_DEHACKED;	// Signals the state has been modified by dehacked
		if ((unsigned)(frame & 0x7fff) > 63)
		{
			Printf("Frame %d: Subnumber must be in range [0,63]\n", frameNum);
		}
		info->Tics = tics;
		info->Misc1 = misc1;
		info->Frame = frame & 0x3f;
		if (frame & 0x8000) info->StateFlags |= STF_FULLBRIGHT;
		else info->StateFlags &= ~STF_FULLBRIGHT;
	}

	return result;
}